

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemViewPrivate::addEditor
          (QAbstractItemViewPrivate *this,QModelIndex *index,QWidget *editor,bool isStatic)

{
  long in_FS_OFFSET;
  QPersistentModelIndex local_60;
  QWidget *local_58;
  QEditorInfo local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = editor;
  QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_50,index);
  QHash<QWidget*,QPersistentModelIndex>::emplace<QPersistentModelIndex_const&>
            ((QHash<QWidget*,QPersistentModelIndex> *)&this->editorIndexHash,&local_58,
             (QPersistentModelIndex *)&local_50);
  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_50);
  QPersistentModelIndex::QPersistentModelIndex(&local_60,index);
  QEditorInfo::QEditorInfo(&local_50,local_58,isStatic);
  QHash<QPersistentModelIndex,QEditorInfo>::emplace<QEditorInfo_const&>
            ((QHash<QPersistentModelIndex,QEditorInfo> *)&this->indexEditorHash,&local_60,&local_50)
  ;
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_50);
  QPersistentModelIndex::~QPersistentModelIndex(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::addEditor(const QModelIndex &index, QWidget *editor, bool isStatic)
{
    editorIndexHash.insert(editor, index);
    indexEditorHash.insert(index, QEditorInfo(editor, isStatic));
}